

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

TFactor<double> * __thiscall
libDAI::TFactor<double>::divided_by(TFactor<double> *this,TFactor<double> *denom)

{
  TFactor<double> *in_RDI;
  TFactor<double> *quot;
  TFactor<double> *in_stack_ffffffffffffffd0;
  TProb<double> *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  
  uVar1 = 0;
  TFactor(in_stack_ffffffffffffffd0,in_RDI);
  TProb<double>::operator/=
            ((TProb<double> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

TFactor<T> divided_by( const TFactor<T>& denom ) const { 
#ifdef DEBUG
                assert( denom._vs == _vs );
#endif
                TFactor<T> quot(*this); 
                quot._p /= denom._p; 
                return quot; 
            }